

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cord.cc
# Opt level: O3

Nullable<CordRep_*> absl::lts_20250127::VerifyTree(Nullable<CordRep_*> node)

{
  Nonnull<CordRep_*> root;
  byte bVar1;
  reference ppCVar2;
  Nonnull<CordRep_*> in_RCX;
  int iVar3;
  string death_message;
  InlinedVector<absl::lts_20250127::cord_internal::CordRep_*,_2UL,_std::allocator<absl::lts_20250127::cord_internal::CordRep_*>_>
  worklist;
  string local_90;
  undefined1 *local_70 [2];
  undefined1 local_60 [16];
  ulong local_50;
  void *local_48;
  long local_40;
  Nullable<CordRep_*> local_38;
  
  if (node != (Nullable<CordRep_*>)0x0) {
    local_50 = 0;
    local_38 = node;
    inlined_vector_internal::
    Storage<absl::lts_20250127::cord_internal::CordRep*,2ul,std::allocator<absl::lts_20250127::cord_internal::CordRep*>>
    ::EmplaceBack<absl::lts_20250127::cord_internal::CordRep*const&>
              ((Storage<absl::lts_20250127::cord_internal::CordRep*,2ul,std::allocator<absl::lts_20250127::cord_internal::CordRep*>>
                *)&local_50,&local_38);
    do {
      ppCVar2 = InlinedVector<absl::lts_20250127::cord_internal::CordRep_*,_2UL,_std::allocator<absl::lts_20250127::cord_internal::CordRep_*>_>
                ::back((InlinedVector<absl::lts_20250127::cord_internal::CordRep_*,_2UL,_std::allocator<absl::lts_20250127::cord_internal::CordRep_*>_>
                        *)&local_50);
      if (local_50 < 2) {
        VerifyTree();
LAB_00318ede:
        local_70[0] = local_60;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_70,"Check node != nullptr failed: ","");
        ReportError_abi_cxx11_(&local_90,(lts_20250127 *)node,(Nonnull<CordRep_*>)0x0,in_RCX);
        std::__cxx11::string::_M_append((char *)local_70,(ulong)local_90._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_90._M_dataplus._M_p != &local_90.field_2) {
          operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
        }
        (*(code *)raw_log_internal::internal_log_function_abi_cxx11_)
                  (3,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/strings/cord.cc"
                   ,0x5f3,local_70);
        __assert_fail("false && \"ABSL_UNREACHABLE reached\"",
                      "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/strings/cord.cc"
                      ,0x5f3,
                      "bool absl::VerifyNode(absl::Nonnull<CordRep *>, absl::Nonnull<CordRep *>)");
      }
      root = *ppCVar2;
      local_50 = local_50 - 2;
      if (root == (Nonnull<CordRep_*>)0x0) goto LAB_00318ede;
      if (root == node) {
        bVar1 = root->tag;
      }
      else {
        if (root->length == 0) {
          local_70[0] = local_60;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_70,"Check node->length != 0 failed: ","");
          ReportError_abi_cxx11_(&local_90,(lts_20250127 *)node,root,in_RCX);
          std::__cxx11::string::_M_append((char *)local_70,(ulong)local_90._M_dataplus._M_p);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_90._M_dataplus._M_p != &local_90.field_2) {
            operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
          }
          (*(code *)raw_log_internal::internal_log_function_abi_cxx11_)
                    (3,
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/strings/cord.cc"
                     ,0x5f5,local_70);
          __assert_fail("false && \"ABSL_UNREACHABLE reached\"",
                        "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/strings/cord.cc"
                        ,0x5f5,
                        "bool absl::VerifyNode(absl::Nonnull<CordRep *>, absl::Nonnull<CordRep *>)")
          ;
        }
        bVar1 = root->tag;
        if (bVar1 == 2) {
          local_70[0] = local_60;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_70,"Check !node->IsCrc() failed: ","");
          ReportError_abi_cxx11_(&local_90,(lts_20250127 *)node,root,in_RCX);
          std::__cxx11::string::_M_append((char *)local_70,(ulong)local_90._M_dataplus._M_p);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_90._M_dataplus._M_p != &local_90.field_2) {
            operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
          }
          (*(code *)raw_log_internal::internal_log_function_abi_cxx11_)
                    (3,
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/strings/cord.cc"
                     ,0x5f6,local_70);
          __assert_fail("false && \"ABSL_UNREACHABLE reached\"",
                        "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/strings/cord.cc"
                        ,0x5f6,
                        "bool absl::VerifyNode(absl::Nonnull<CordRep *>, absl::Nonnull<CordRep *>)")
          ;
        }
      }
      if (bVar1 < 6) {
        if (bVar1 == 1) {
          in_RCX = (Nonnull<CordRep_*>)**(undefined8 **)&root[1].refcount;
          if (in_RCX <= (Nonnull<CordRep_*>)root[1].length) {
            local_70[0] = local_60;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_70,
                       "Check node->substring()->start < node->substring()->child->length failed: ",
                       "");
            ReportError_abi_cxx11_(&local_90,(lts_20250127 *)node,root,in_RCX);
            std::__cxx11::string::_M_append((char *)local_70,(ulong)local_90._M_dataplus._M_p);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_90._M_dataplus._M_p != &local_90.field_2) {
              operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
            }
            (*(code *)raw_log_internal::internal_log_function_abi_cxx11_)
                      (3,
                       "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/strings/cord.cc"
                       ,0x602,local_70);
            __assert_fail("false && \"ABSL_UNREACHABLE reached\"",
                          "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/strings/cord.cc"
                          ,0x602,
                          "bool absl::VerifyNode(absl::Nonnull<CordRep *>, absl::Nonnull<CordRep *>)"
                         );
          }
          if (in_RCX < (Nonnull<CordRep_*>)
                       (((Nonnull<CordRep_*>)root[1].length)->storage + (root->length - 0xd))) {
            local_70[0] = local_60;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_70,
                       "Check node->substring()->start + node->length <= node->substring()->child->length failed: "
                       ,"");
            ReportError_abi_cxx11_(&local_90,(lts_20250127 *)node,root,in_RCX);
            std::__cxx11::string::_M_append((char *)local_70,(ulong)local_90._M_dataplus._M_p);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_90._M_dataplus._M_p != &local_90.field_2) {
              operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
            }
            (*(code *)raw_log_internal::internal_log_function_abi_cxx11_)
                      (3,
                       "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/strings/cord.cc"
                       ,0x605,local_70);
            __assert_fail("false && \"ABSL_UNREACHABLE reached\"",
                          "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/strings/cord.cc"
                          ,0x605,
                          "bool absl::VerifyNode(absl::Nonnull<CordRep *>, absl::Nonnull<CordRep *>)"
                         );
          }
        }
        else if (bVar1 == 2) {
          in_RCX = (Nonnull<CordRep_*>)root[1].length;
          if (in_RCX == (Nonnull<CordRep_*>)0x0) {
            if (root->length != 0) {
              local_70[0] = local_60;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_70,
                         "Check node->crc()->child != nullptr || node->crc()->length == 0 failed: ",
                         "");
              ReportError_abi_cxx11_(&local_90,(lts_20250127 *)node,root,in_RCX);
              std::__cxx11::string::_M_append((char *)local_70,(ulong)local_90._M_dataplus._M_p);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_90._M_dataplus._M_p != &local_90.field_2) {
                operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1
                               );
              }
              (*(code *)raw_log_internal::internal_log_function_abi_cxx11_)
                        (3,
                         "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/strings/cord.cc"
                         ,0x609,local_70);
              __assert_fail("false && \"ABSL_UNREACHABLE reached\"",
                            "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/strings/cord.cc"
                            ,0x609,
                            "bool absl::VerifyNode(absl::Nonnull<CordRep *>, absl::Nonnull<CordRep *>)"
                           );
            }
          }
          else {
            if (root->length != in_RCX->length) {
              local_70[0] = local_60;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_70,
                         "Check node->crc()->length == node->crc()->child->length failed: ","");
              ReportError_abi_cxx11_(&local_90,(lts_20250127 *)node,root,in_RCX);
              std::__cxx11::string::_M_append((char *)local_70,(ulong)local_90._M_dataplus._M_p);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_90._M_dataplus._M_p != &local_90.field_2) {
                operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1
                               );
              }
              (*(code *)raw_log_internal::internal_log_function_abi_cxx11_)
                        (3,
                         "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/strings/cord.cc"
                         ,0x60c,local_70);
              __assert_fail("false && \"ABSL_UNREACHABLE reached\"",
                            "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/strings/cord.cc"
                            ,0x60c,
                            "bool absl::VerifyNode(absl::Nonnull<CordRep *>, absl::Nonnull<CordRep *>)"
                           );
            }
            inlined_vector_internal::
            Storage<absl::lts_20250127::cord_internal::CordRep*,2ul,std::allocator<absl::lts_20250127::cord_internal::CordRep*>>
            ::EmplaceBack<absl::lts_20250127::cord_internal::CordRep*const&>
                      ((Storage<absl::lts_20250127::cord_internal::CordRep*,2ul,std::allocator<absl::lts_20250127::cord_internal::CordRep*>>
                        *)&local_50,(CordRep **)(root + 1));
          }
        }
        else if ((bVar1 == 5) && (root[1].length == 0)) {
          local_70[0] = local_60;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_70,"Check node->external()->base != nullptr failed: ","");
          ReportError_abi_cxx11_(&local_90,(lts_20250127 *)node,root,in_RCX);
          std::__cxx11::string::_M_append((char *)local_70,(ulong)local_90._M_dataplus._M_p);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_90._M_dataplus._M_p != &local_90.field_2) {
            operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
          }
          (*(code *)raw_log_internal::internal_log_function_abi_cxx11_)
                    (3,
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/strings/cord.cc"
                     ,0x5fe,local_70);
          __assert_fail("false && \"ABSL_UNREACHABLE reached\"",
                        "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/strings/cord.cc"
                        ,0x5fe,
                        "bool absl::VerifyNode(absl::Nonnull<CordRep *>, absl::Nonnull<CordRep *>)")
          ;
        }
      }
      else {
        if (0xf8 < bVar1) {
          __assert_fail("tag >= FLAT && tag <= MAX_FLAT_TAG",
                        "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/strings/internal/cord_rep_flat.h"
                        ,0xb6,"CordRepFlat *absl::cord_internal::CordRep::flat()");
        }
        in_RCX = (Nonnull<CordRep_*>)0xc;
        if (bVar1 < 0xbb) {
          in_RCX = (Nonnull<CordRep_*>)&DAT_00000006;
        }
        iVar3 = -0xb800d;
        if (bVar1 < 0xbb) {
          iVar3 = -0xe8d;
        }
        if (bVar1 < 0x43) {
          in_RCX = (Nonnull<CordRep_*>)0x3;
          iVar3 = -0x1d;
        }
        if ((ulong)(long)(int)(((uint)bVar1 << (sbyte)in_RCX) + iVar3) < root->length) {
          local_70[0] = local_60;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_70,"Check node->length <= node->flat()->Capacity() failed: ",""
                    );
          ReportError_abi_cxx11_(&local_90,(lts_20250127 *)node,root,in_RCX);
          std::__cxx11::string::_M_append((char *)local_70,(ulong)local_90._M_dataplus._M_p);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_90._M_dataplus._M_p != &local_90.field_2) {
            operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
          }
          (*(code *)raw_log_internal::internal_log_function_abi_cxx11_)
                    (3,
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/strings/cord.cc"
                     ,0x5fb,local_70);
          __assert_fail("false && \"ABSL_UNREACHABLE reached\"",
                        "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/strings/cord.cc"
                        ,0x5fb,
                        "bool absl::VerifyNode(absl::Nonnull<CordRep *>, absl::Nonnull<CordRep *>)")
          ;
        }
      }
    } while (1 < local_50);
    if (local_50 != 0) {
      operator_delete(local_48,local_40 << 3);
    }
  }
  return node;
}

Assistant:

static inline absl::Nullable<CordRep*> VerifyTree(
    absl::Nullable<CordRep*> node) {
  assert(node == nullptr || VerifyNode(node, node));
  static_cast<void>(&VerifyNode);
  return node;
}